

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O1

ssize_t __thiscall
libchars::terminal_driver::read(terminal_driver *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 in_register_00000034;
  ulong unaff_R13;
  bool bVar6;
  undefined1 local_68 [8];
  timeval T_start;
  timeval T_now;
  
  if (this->rbuf_enq <= this->rbuf_deq) {
    gettimeofday((timeval *)local_68,(__timezone_ptr_t)0x0);
    do {
      uVar1 = this->rbuf_enq;
      uVar2 = this->rbuf_deq;
      if (uVar2 < uVar1) {
        uVar5 = unaff_R13 & 0xffffffff;
        break;
      }
      bVar6 = false;
      uVar3 = read_characters(this,false);
      uVar5 = CONCAT44(extraout_var,uVar3);
      if (-1 < (int)uVar3) {
        bVar6 = uVar3 != 0;
        uVar5 = (ulong)uVar3;
        if (bVar6) {
          uVar5 = unaff_R13 & 0xffffffff;
        }
        if (__buf != (void *)0x0 && !bVar6) {
          bVar6 = false;
          iVar4 = gettimeofday((timeval *)&T_start.tv_usec,(__timezone_ptr_t)0x0);
          uVar5 = 0;
          if (iVar4 == 0) {
            bVar6 = (ulong)T_now.tv_sec / 1000 + T_start.tv_usec * 1000 <
                    ((long)local_68 + (long)__buf) * 1000 + (ulong)T_start.tv_sec / 1000;
            uVar5 = unaff_R13 & 0xffffffff;
            if (!bVar6) {
              uVar5 = 0xfffffffd;
            }
          }
        }
      }
      unaff_R13 = uVar5 & 0xffffffff;
    } while (bVar6);
    if (uVar1 <= uVar2) {
      return uVar5;
    }
  }
  *(uint8_t *)CONCAT44(in_register_00000034,__fd) = this->rbuf[this->rbuf_size - 1 & this->rbuf_deq]
  ;
  this->rbuf_deq = this->rbuf_deq + 1;
  return 1;
}

Assistant:

int terminal_driver::read(uint8_t &c, size_t timeout_s)
    {
        if (rbuf_enq <= rbuf_deq) {
            struct timeval T_start;
            gettimeofday(&T_start, NULL);
            uint64_t t_msec_start = T_start.tv_sec * 1000ULL + T_start.tv_usec/1000ULL;
            uint64_t timeout_ms = timeout_s * 1000UL;

            while (rbuf_enq <= rbuf_deq) {
                int r = read_characters(false);
                if (r < 0)
                    return r;
                else if (r == 0) {
                    if (timeout_s > 0) {
                        struct timeval T_now;
                        if (gettimeofday(&T_now, NULL) == 0) {
                            uint64_t t_msec_now = T_now.tv_sec * 1000ULL + T_now.tv_usec/1000ULL;
                            if (t_msec_now >= (t_msec_start + timeout_ms))
                                return -3;
                        }
                        else {
                            return r;
                        }
                    }
                    else {
                        return r;
                    }
                }
            }
        }

        size_t rbuf_mask = (rbuf_size - 1);
        c = *(rbuf + (rbuf_deq & rbuf_mask));
        ++rbuf_deq;

        return 1;
    }